

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSMisc.h
# Opt level: O0

char * stristr(char *String,char *Pattern)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char *local_38;
  char *start;
  char *sptr;
  char *pptr;
  char *Pattern_local;
  char *String_local;
  
  local_38 = String;
  while( true ) {
    if (*local_38 == '\0') {
      return (char *)0x0;
    }
    while( true ) {
      bVar3 = false;
      if (*local_38 != '\0') {
        iVar1 = toupper((int)*local_38);
        iVar2 = toupper((int)*Pattern);
        bVar3 = iVar1 != iVar2;
      }
      if (!bVar3) break;
      local_38 = local_38 + 1;
    }
    if (*local_38 == '\0') break;
    start = local_38;
    sptr = Pattern;
    while( true ) {
      iVar1 = toupper((int)*start);
      iVar2 = toupper((int)*sptr);
      if (iVar1 != iVar2) break;
      start = start + 1;
      sptr = sptr + 1;
      if (*sptr == '\0') {
        return local_38;
      }
    }
    local_38 = local_38 + 1;
  }
  return (char *)0x0;
}

Assistant:

inline char* stristr(char* String, char* Pattern)
{
	char* pptr = NULL;
	char* sptr = NULL;
	char* start = NULL;

	for (start = (char*)String; *start != 0; start++)
	{
		// Find start of pattern in string.
		for (; ((*start != 0) && (toupper(*start)!= toupper(*Pattern))); start++)
			;
		if (0 == *start)
			return NULL;

		pptr = (char*)Pattern;
		sptr = (char*)start;

		while (toupper(*sptr) == toupper(*pptr))
		{
			sptr++;
			pptr++;

			// If end of pattern then pattern was found.

			if (0 == *pptr)
				return (start);
		}
	}

	return NULL;
}